

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O1

UBool ucnv_extInitialMatchToU_63
                (UConverter *cnv,int32_t *cx,int32_t firstLength,char **src,char *srcLimit,
                UChar **target,UChar *targetLimit,int32_t **offsets,int32_t srcIndex,UBool flush,
                UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  int32_t iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  int8_t sisoState;
  long lVar6;
  UBool in_stack_ffffffffffffffb8;
  uint32_t value;
  UChar **local_38;
  
  value = 0;
  uVar1 = (cnv->sharedData->mbcs).outputType;
  if (uVar1 == '\f') {
    sisoState = (int8_t)cnv->mode;
  }
  else {
    sisoState = (uVar1 == 0xdb) * '\x02' + -1;
  }
  pcVar5 = *src;
  local_38 = target;
  iVar2 = ucnv_extMatchToU(cx,sisoState,(char *)cnv->toUBytes,firstLength,pcVar5,
                           (int)srcLimit - (int)pcVar5,&value,flush,in_stack_ffffffffffffffb8);
  if (iVar2 < 1) {
    uVar4 = 0;
    if (-1 < iVar2) goto LAB_001b791c;
    cnv->preToUFirstLength = (int8_t)firstLength;
    if (0 < firstLength) {
      uVar4 = 0;
      do {
        cnv->preToU[uVar4] = cnv->toUBytes[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)firstLength != uVar4);
    }
    pcVar5 = *src;
    uVar3 = -iVar2;
    if (SBORROW4((int)uVar4,uVar3) != (int)uVar4 + iVar2 < 0) {
      lVar6 = 0;
      do {
        cnv->preToU[lVar6 + (uVar4 & 0xffffffff)] = pcVar5[lVar6];
        lVar6 = lVar6 + 1;
      } while ((ulong)uVar3 - (uVar4 & 0xffffffff) != lVar6);
      pcVar5 = pcVar5 + lVar6;
    }
    *src = pcVar5;
    cnv->preToULength = (int8_t)uVar3;
  }
  else {
    *src = pcVar5 + (iVar2 - firstLength);
    if (value < 0x300000) {
      ucnv_toUWriteCodePoint_63
                (cnv,value - 0x1f0000,local_38,targetLimit,offsets,srcIndex,pErrorCode);
    }
    else {
      ucnv_toUWriteUChars_63
                (cnv,(UChar *)((long)cx + (ulong)(value & 0x3ffff) * 2 + (long)cx[3]),
                 (value >> 0x12) - 0xc,local_38,targetLimit,offsets,srcIndex,pErrorCode);
    }
  }
  uVar4 = 1;
LAB_001b791c:
  return (UBool)uVar4;
}

Assistant:

U_CFUNC UBool
ucnv_extInitialMatchToU(UConverter *cnv, const int32_t *cx,
                        int32_t firstLength,
                        const char **src, const char *srcLimit,
                        UChar **target, const UChar *targetLimit,
                        int32_t **offsets, int32_t srcIndex,
                        UBool flush,
                        UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    /* try to match */
    match=ucnv_extMatchToU(cx, (int8_t)UCNV_SISO_STATE(cnv),
                           (const char *)cnv->toUBytes, firstLength,
                           *src, (int32_t)(srcLimit-*src),
                           &value,
                           cnv->useFallback, flush);
    if(match>0) {
        /* advance src pointer for the consumed input */
        *src+=match-firstLength;

        /* write result to target */
        ucnv_extWriteToU(cnv, cx,
                         value,
                         target, targetLimit,
                         offsets, srcIndex,
                         pErrorCode);
        return TRUE;
    } else if(match<0) {
        /* save state for partial match */
        const char *s;
        int32_t j;

        /* copy the first code point */
        s=(const char *)cnv->toUBytes;
        cnv->preToUFirstLength=(int8_t)firstLength;
        for(j=0; j<firstLength; ++j) {
            cnv->preToU[j]=*s++;
        }

        /* now copy the newly consumed input */
        s=*src;
        match=-match;
        for(; j<match; ++j) {
            cnv->preToU[j]=*s++;
        }
        *src=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preToULength=(int8_t)match;
        return TRUE;
    } else /* match==0 no match */ {
        return FALSE;
    }
}